

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void sptk::world::LinearSmoothing(double *input,double width,int fs,int fft_size,double *output)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  ulong uVar7;
  double *mirroring_spectrum_00;
  double *mirroring_segment_00;
  double *frequency_axis_00;
  void *pvVar8;
  void *x;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  double *in_RDI;
  double in_XMM0_Qa;
  double shift;
  double *y;
  int i_1;
  int i;
  double discrete_frequency_interval;
  double origin_of_mirroring_axis;
  double *high_levels;
  double *low_levels;
  double *frequency_axis;
  double *mirroring_segment;
  double *mirroring_spectrum;
  int boundary;
  double *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff8c;
  double *xi;
  int local_68;
  int in_stack_ffffffffffffff9c;
  
  iVar6 = (int)((in_XMM0_Qa * (double)in_EDX) / (double)in_ESI) + 1;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(in_EDX / 2 + iVar6 * 2 + 1);
  uVar7 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  mirroring_spectrum_00 = (double *)operator_new__(uVar7);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(in_EDX / 2 + iVar6 * 2 + 1);
  uVar7 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  mirroring_segment_00 = (double *)operator_new__(uVar7);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(in_EDX / 2 + 1);
  uVar7 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  frequency_axis_00 = (double *)operator_new__(uVar7);
  anon_unknown_3::SetParametersForLinearSmoothing
            (iVar6,in_EDX,in_ESI,in_XMM0_Qa,in_RDI,mirroring_spectrum_00,mirroring_segment_00,
             frequency_axis_00);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)(in_EDX / 2 + 1);
  uVar7 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pvVar8 = operator_new__(uVar7);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)(in_EDX / 2 + 1);
  uVar7 = SUB168(auVar5 * ZEXT816(8),0);
  if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  x = operator_new__(uVar7);
  shift = (-((double)iVar6 - 0.5) * (double)in_ESI) / (double)in_EDX;
  y = (double *)((double)in_ESI / (double)in_EDX);
  xi = frequency_axis_00;
  interp1Q((double)x,shift,y,in_stack_ffffffffffffff9c,frequency_axis_00,in_stack_ffffffffffffff8c,
           in_stack_ffffffffffffff80);
  for (iVar6 = 0; iVar6 <= in_EDX / 2; iVar6 = iVar6 + 1) {
    frequency_axis_00[iVar6] = in_XMM0_Qa + frequency_axis_00[iVar6];
  }
  interp1Q((double)x,shift,y,iVar6,xi,iVar6,frequency_axis_00);
  for (local_68 = 0; local_68 <= in_EDX / 2; local_68 = local_68 + 1) {
    *(double *)(in_RCX + (long)local_68 * 8) =
         (*(double *)((long)x + (long)local_68 * 8) - *(double *)((long)pvVar8 + (long)local_68 * 8)
         ) / in_XMM0_Qa;
  }
  if (mirroring_spectrum_00 != (double *)0x0) {
    operator_delete__(mirroring_spectrum_00);
  }
  if (mirroring_segment_00 != (double *)0x0) {
    operator_delete__(mirroring_segment_00);
  }
  if (frequency_axis_00 != (double *)0x0) {
    operator_delete__(frequency_axis_00);
  }
  if (pvVar8 != (void *)0x0) {
    operator_delete__(pvVar8);
  }
  if (x != (void *)0x0) {
    operator_delete__(x);
  }
  return;
}

Assistant:

void LinearSmoothing(const double *input, double width, int fs, int fft_size,
    double *output) {
  int boundary = static_cast<int>(width * fft_size / fs) + 1;

  // These parameters are set by the other function.
  double *mirroring_spectrum = new double[fft_size / 2 + boundary * 2 + 1];
  double *mirroring_segment = new double[fft_size / 2 + boundary * 2 + 1];
  double *frequency_axis = new double[fft_size / 2 + 1];
  SetParametersForLinearSmoothing(boundary, fft_size, fs, width,
      input, mirroring_spectrum, mirroring_segment, frequency_axis);

  double *low_levels = new double[fft_size / 2 + 1];
  double *high_levels = new double[fft_size / 2 + 1];
  double origin_of_mirroring_axis = -(boundary - 0.5) * fs / fft_size;
  double discrete_frequency_interval = static_cast<double>(fs) / fft_size;

  interp1Q(origin_of_mirroring_axis, discrete_frequency_interval,
      mirroring_segment, fft_size / 2 + boundary * 2 + 1, frequency_axis,
      fft_size / 2 + 1, low_levels);

  for (int i = 0; i <= fft_size / 2; ++i) frequency_axis[i] += width;

  interp1Q(origin_of_mirroring_axis, discrete_frequency_interval,
      mirroring_segment, fft_size / 2 + boundary * 2 + 1, frequency_axis,
      fft_size / 2 + 1, high_levels);

  for (int i = 0; i <= fft_size / 2; ++i)
    output[i] = (high_levels[i] - low_levels[i]) / width;

  delete[] mirroring_spectrum;
  delete[] mirroring_segment;
  delete[] frequency_axis;
  delete[] low_levels;
  delete[] high_levels;
}